

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangulate.cc
# Opt level: O2

bool sfm::is_consistent_pose(Correspondence2D2D *match,CameraPose *pose1,CameraPose *pose2)

{
  undefined1 local_90 [8];
  Vector<double,_3> x;
  undefined1 local_60 [8];
  Vector<double,_3> x1;
  Vector<double,_3> x2;
  
  triangulate_match((Vector<double,_3> *)local_90,match,pose1,pose2);
  math::Matrix<double,_3,_3>::mult
            ((Vector<double,_3> *)(x1.v + 2),&pose1->R,(Vector<double,_3> *)local_90);
  math::Vector<double,_3>::operator+
            ((Vector<double,_3> *)local_60,(Vector<double,_3> *)(x1.v + 2),&pose1->t);
  math::Matrix<double,_3,_3>::mult
            ((Vector<double,_3> *)(x.v + 2),&pose2->R,(Vector<double,_3> *)local_90);
  math::Vector<double,_3>::operator+
            ((Vector<double,_3> *)(x1.v + 2),(Vector<double,_3> *)(x.v + 2),&pose2->t);
  return (bool)(-(0.0 < x2.v[1]) & -(0.0 < x1.v[1]) & 1);
}

Assistant:

bool
is_consistent_pose (Correspondence2D2D const& match,
    CameraPose const& pose1, CameraPose const& pose2)
{
    math::Vector<double, 3> x = triangulate_match(match, pose1, pose2);
    math::Vector<double, 3> x1 = pose1.R * x + pose1.t;
    math::Vector<double, 3> x2 = pose2.R * x + pose2.t;
    return x1[2] > 0.0f && x2[2] > 0.0f;
}